

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O3

bool __thiscall
btConvexHullInternal::shiftFace
          (btConvexHullInternal *this,Face *face,btScalar amount,
          btAlignedObjectArray<btConvexHullInternal::Vertex_*> *stack)

{
  Int128 *this_00;
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Face *pFVar5;
  Face *pFVar6;
  Edge *pEVar7;
  Vertex *pVVar8;
  undefined1 auVar9 [12];
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  Edge *pEVar14;
  Vertex *pVVar15;
  Vertex **ppVVar16;
  Edge *pEVar17;
  Edge *pEVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  Face **ppFVar27;
  int curSize;
  Edge *e;
  Edge *pEVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  ulong b;
  long lVar33;
  long lVar34;
  long b_00;
  long lVar35;
  uint64_t lo_2;
  ulong uVar36;
  int iVar37;
  Edge *pEVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  uint uVar42;
  uint uVar43;
  int iVar44;
  long lVar45;
  long lVar46;
  ulong uVar47;
  bool bVar48;
  btScalar bVar49;
  btScalar bVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  btVector3 bVar54;
  Int128 IVar55;
  Int128 IVar56;
  Int128 IVar57;
  Int128 IVar58;
  Int128 IVar59;
  Int128 IVar60;
  Int128 IVar61;
  Int128 IVar62;
  Int128 IVar63;
  Int128 IVar64;
  Int128 IVar65;
  Int128 IVar66;
  Int128 IVar67;
  Int128 IVar68;
  Int128 IVar69;
  Point64 normal;
  Rational128 dot;
  btVector3 origShift;
  Int128 det;
  Rational128 optDot;
  Edge *local_188;
  uint64_t local_170;
  uint64_t local_168;
  int local_130;
  Point64 local_128;
  Rational128 local_110;
  undefined1 local_e8 [8];
  float fStack_e0;
  undefined4 uStack_dc;
  long local_d8;
  ulong local_d0;
  long local_c8;
  Edge *local_c0;
  Edge *local_b8;
  Int128 local_b0;
  ulong local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  Pool<btConvexHullInternal::Vertex> *local_80;
  uint64_t local_78;
  uint64_t local_70;
  Edge *local_68;
  Vertex *local_60;
  Rational128 local_58;
  
  bVar54 = getBtNormal(this,face);
  fVar53 = (float)((uint)amount ^ (uint)DAT_001ee270);
  fVar51 = fVar53 * bVar54.m_floats[0];
  fVar52 = fVar53 * bVar54.m_floats[1];
  fVar53 = fVar53 * bVar54.m_floats[2];
  auVar9._4_4_ = fVar52;
  auVar9._0_4_ = fVar51;
  auVar9._8_4_ = fVar53;
  uStack_dc = 0;
  _local_e8 = auVar9;
  fVar1 = (this->scaling).m_floats[0];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    stack0xffffffffffffff1c = auVar9._4_8_;
    local_e8._0_4_ = fVar51 / fVar1;
    uStack_dc = 0;
  }
  fVar1 = (this->scaling).m_floats[1];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    local_e8._4_4_ = fVar52 / fVar1;
  }
  fVar1 = (this->scaling).m_floats[2];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fStack_e0 = fVar53 / fVar1;
  }
  if ((((int)*(float *)(local_e8 + (long)this->medAxis * 4) == 0) &&
      ((int)*(float *)(local_e8 + (long)this->maxAxis * 4) == 0)) &&
     ((int)*(float *)(local_e8 + (long)this->minAxis * 4) == 0)) {
    return true;
  }
  iVar10 = (face->dir0).x;
  iVar12 = (face->dir0).y;
  iVar11 = (face->dir1).z;
  iVar37 = (face->dir0).z;
  iVar44 = (face->dir1).y;
  local_128.x = (int64_t)(iVar11 * iVar12 - iVar44 * iVar37);
  iVar2 = (face->dir1).x;
  local_128.y = (int64_t)(iVar37 * iVar2 - iVar11 * iVar10);
  local_128.z = (int64_t)(iVar10 * iVar44 - iVar2 * iVar12);
  lVar31 = (long)(face->origin).x;
  b = (int)*(float *)(local_e8 + (long)this->medAxis * 4) + lVar31;
  lVar29 = (long)(face->origin).y;
  local_c8 = (int)*(float *)(local_e8 + (long)this->maxAxis * 4) + lVar29;
  lVar24 = (long)(face->origin).z;
  local_d0 = (int)*(float *)(local_e8 + (long)this->minAxis * 4) + lVar24;
  lVar45 = local_128.z * local_d0 + local_128.y * local_c8 + local_128.x * b;
  if (lVar45 < lVar24 * local_128.z + lVar29 * local_128.y + lVar31 * local_128.x) {
    pEVar28 = face->nearbyVertex->edges;
    Vertex::dot(&local_58,face->nearbyVertex,&local_128);
    iVar10 = Rational128::compare(&local_58,lVar45);
    if (iVar10 < 0) {
      pEVar38 = pEVar28;
      do {
        Vertex::dot(&local_110,pEVar28->target,&local_128);
        iVar10 = Rational128::compare(&local_110,&local_58);
        if (0 < iVar10) {
          iVar10 = Rational128::compare(&local_110,lVar45);
          if (-1 < iVar10) goto LAB_0012bb83;
          local_58.denominator.low = local_110.denominator.low;
          local_58.numerator.low = local_110.numerator.low;
          pEVar28 = pEVar28->reverse;
          pEVar38 = pEVar28;
        }
        pEVar28 = pEVar28->prev;
        if (pEVar28 == pEVar38) {
          return true;
        }
      } while( true );
    }
    pEVar38 = pEVar28;
    do {
      Vertex::dot(&local_110,pEVar28->target,&local_128);
      iVar11 = Rational128::compare(&local_110,&local_58);
      iVar12 = iVar10;
      if (iVar11 < 0) {
        iVar12 = Rational128::compare(&local_110,lVar45);
        local_58.denominator.low = local_110.denominator.low;
        local_58.numerator.low = local_110.numerator.low;
        pEVar28 = pEVar28->reverse;
        pEVar38 = pEVar28;
        if (iVar12 < 0) {
          if (pEVar28 == (Edge *)0x0) {
            return false;
          }
LAB_0012bb83:
          if (iVar10 == 0) {
            pEVar38 = pEVar28->reverse->next;
            while( true ) {
              Vertex::dot(&local_110,pEVar38->target,&local_128);
              iVar12 = Rational128::compare(&local_110,lVar45);
              if (0 < iVar12) break;
              pEVar38 = pEVar38->next;
              if (pEVar38 == pEVar28->reverse) {
                return true;
              }
            }
          }
          local_98 = local_c8 << 0x20;
          local_a0 = local_d0 | 0xffffffff00000000;
          local_80 = &this->vertexPool;
          local_188 = (Edge *)0x0;
          local_88 = (long)(int)local_c8;
          local_90 = (long)(int)local_d0;
          local_c0 = (Edge *)0x0;
          pEVar38 = (Edge *)0x0;
          local_d8 = lVar45;
          do {
            pEVar14 = pEVar28;
            if (iVar10 == 0) {
              pEVar17 = pEVar28->reverse->next;
              Vertex::dot(&local_110,pEVar17->target,&local_128);
              iVar12 = Rational128::compare(&local_110,lVar45);
              pEVar18 = pEVar17;
              while (pEVar14 = pEVar28, iVar12 < 0) {
                pEVar14 = pEVar18->next;
                if (pEVar14 == pEVar17) {
                  return true;
                }
                pEVar28 = pEVar18->reverse;
                Vertex::dot(&local_110,pEVar14->target,&local_128);
                iVar12 = Rational128::compare(&local_110,lVar45);
                pEVar18 = pEVar14;
              }
            }
            local_130 = (int)b;
            pEVar17 = pEVar14;
            if ((local_c0 != (Edge *)0x0) && (pEVar17 = local_c0, pEVar14 == local_c0)) {
              if (iVar10 < 1) {
                if (local_188 != pEVar38->reverse) {
                  btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                            (stack,&pEVar38->target);
                  pEVar28 = local_188->next;
                  if (pEVar28 != pEVar38->reverse) {
                    do {
                      pVVar15 = pEVar28->target;
                      removeEdgePair(this,pEVar28);
                      uVar13 = stack->m_size;
                      if (uVar13 == stack->m_capacity) {
                        iVar10 = uVar13 * 2;
                        if (uVar13 == 0) {
                          iVar10 = 1;
                        }
                        if ((int)uVar13 < iVar10) {
                          if (iVar10 == 0) {
                            ppVVar16 = (Vertex **)0x0;
                          }
                          else {
                            ppVVar16 = (Vertex **)btAlignedAllocInternal((long)iVar10 << 3,0x10);
                            uVar13 = stack->m_size;
                          }
                          if (0 < (int)uVar13) {
                            uVar19 = 0;
                            do {
                              ppVVar16[uVar19] = stack->m_data[uVar19];
                              uVar19 = uVar19 + 1;
                            } while (uVar13 != uVar19);
                          }
                          if ((stack->m_data != (Vertex **)0x0) && (stack->m_ownsMemory == true)) {
                            btAlignedFreeInternal(stack->m_data);
                            uVar13 = stack->m_size;
                          }
                          stack->m_ownsMemory = true;
                          stack->m_data = ppVVar16;
                          stack->m_capacity = iVar10;
                        }
                      }
                      stack->m_data[(int)uVar13] = pVVar15;
                      stack->m_size = uVar13 + 1;
                      pEVar28 = local_188->next;
                    } while (pEVar28 != pEVar38->reverse);
                  }
                  local_110.numerator.low = 0;
                  btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                            (stack,(Vertex **)&local_110);
                }
              }
              else {
                local_188->reverse->target = pEVar38->target;
                pEVar28 = local_c0->reverse;
                pEVar28->next = local_188;
                local_188->prev = pEVar28;
                pEVar28 = pEVar38->reverse;
                local_188->next = pEVar28;
                pEVar28->prev = local_188;
              }
              this->vertexList = *stack->m_data;
              iVar10 = stack->m_size;
              if (0 < iVar10) {
                uVar19 = 0;
                do {
                  iVar12 = (int)uVar19;
                  pVVar15 = stack->m_data[(long)iVar12 + 1];
                  uVar19 = (ulong)(iVar12 + 2U);
                  if (pVVar15 != (Vertex *)0x0) {
                    pVVar8 = stack->m_data[iVar12];
                    uVar19 = (ulong)(int)(iVar12 + 2U);
                    bVar48 = false;
                    do {
                      ppFVar27 = &pVVar8->lastNearbyFace->nextWithSameNearbyVertex;
                      if (pVVar8->lastNearbyFace == (Face *)0x0) {
                        ppFVar27 = &pVVar8->firstNearbyFace;
                      }
                      pFVar5 = pVVar15->firstNearbyFace;
                      *ppFVar27 = pFVar5;
                      if (pVVar15->lastNearbyFace != (Face *)0x0) {
                        pVVar8->lastNearbyFace = pVVar15->lastNearbyFace;
                        pFVar5 = pVVar15->firstNearbyFace;
                      }
                      for (; pFVar5 != (Face *)0x0; pFVar5 = pFVar5->nextWithSameNearbyVertex) {
                        pFVar5->nearbyVertex = pVVar8;
                      }
                      pVVar15->firstNearbyFace = (Face *)0x0;
                      pVVar15->lastNearbyFace = (Face *)0x0;
                      while (pEVar28 = pVVar15->edges, pEVar28 != (Edge *)0x0) {
                        uVar13 = stack->m_size;
                        uVar43 = stack->m_capacity;
                        if (!bVar48) {
                          if (uVar13 == uVar43) {
                            uVar42 = uVar13 * 2;
                            if (uVar13 == 0) {
                              uVar42 = 1;
                            }
                            uVar43 = uVar13;
                            if ((int)uVar13 < (int)uVar42) {
                              if (uVar42 == 0) {
                                ppVVar16 = (Vertex **)0x0;
                              }
                              else {
                                ppVVar16 = (Vertex **)
                                           btAlignedAllocInternal((long)(int)uVar42 << 3,0x10);
                                uVar13 = stack->m_size;
                              }
                              if (0 < (int)uVar13) {
                                uVar20 = 0;
                                do {
                                  ppVVar16[uVar20] = stack->m_data[uVar20];
                                  uVar20 = uVar20 + 1;
                                } while (uVar13 != uVar20);
                              }
                              if ((stack->m_data != (Vertex **)0x0) && (stack->m_ownsMemory == true)
                                 ) {
                                btAlignedFreeInternal(stack->m_data);
                                uVar13 = stack->m_size;
                              }
                              stack->m_ownsMemory = true;
                              stack->m_data = ppVVar16;
                              stack->m_capacity = uVar42;
                              uVar43 = uVar42;
                            }
                          }
                          stack->m_data[(int)uVar13] = pVVar8;
                          uVar13 = uVar13 + 1;
                          stack->m_size = uVar13;
                          pEVar28 = pVVar15->edges;
                          bVar48 = true;
                        }
                        if (uVar13 == uVar43) {
                          iVar12 = uVar43 * 2;
                          if (uVar43 == 0) {
                            iVar12 = 1;
                          }
                          uVar13 = uVar43;
                          if ((int)uVar43 < iVar12) {
                            if (iVar12 == 0) {
                              ppVVar16 = (Vertex **)0x0;
                            }
                            else {
                              ppVVar16 = (Vertex **)btAlignedAllocInternal((long)iVar12 << 3,0x10);
                              uVar43 = stack->m_size;
                            }
                            if (0 < (int)uVar43) {
                              uVar20 = 0;
                              do {
                                ppVVar16[uVar20] = stack->m_data[uVar20];
                                uVar20 = uVar20 + 1;
                              } while (uVar43 != uVar20);
                            }
                            if ((stack->m_data != (Vertex **)0x0) && (stack->m_ownsMemory == true))
                            {
                              btAlignedFreeInternal(stack->m_data);
                              uVar43 = stack->m_size;
                            }
                            stack->m_ownsMemory = true;
                            stack->m_data = ppVVar16;
                            stack->m_capacity = iVar12;
                            uVar13 = uVar43;
                          }
                        }
                        stack->m_data[(int)uVar13] = pEVar28->target;
                        stack->m_size = uVar13 + 1;
                        removeEdgePair(this,pVVar15->edges);
                      }
                      ppVVar16 = stack->m_data;
                      pVVar15 = ppVVar16[uVar19];
                      uVar19 = uVar19 + 1;
                    } while (pVVar15 != (Vertex *)0x0);
                    if (bVar48) {
                      uVar13 = stack->m_size;
                      if (uVar13 == stack->m_capacity) {
                        iVar12 = uVar13 * 2;
                        if (uVar13 == 0) {
                          iVar12 = 1;
                        }
                        if ((int)uVar13 < iVar12) {
                          if (iVar12 == 0) {
                            ppVVar16 = (Vertex **)0x0;
                          }
                          else {
                            ppVVar16 = (Vertex **)btAlignedAllocInternal((long)iVar12 << 3,0x10);
                            uVar13 = stack->m_size;
                          }
                          if (0 < (int)uVar13) {
                            uVar20 = 0;
                            do {
                              ppVVar16[uVar20] = stack->m_data[uVar20];
                              uVar20 = uVar20 + 1;
                            } while (uVar13 != uVar20);
                          }
                          if ((stack->m_data != (Vertex **)0x0) && (stack->m_ownsMemory == true)) {
                            btAlignedFreeInternal(stack->m_data);
                            uVar13 = stack->m_size;
                          }
                          stack->m_ownsMemory = true;
                          stack->m_data = ppVVar16;
                          stack->m_capacity = iVar12;
                        }
                      }
                      ppVVar16[(int)uVar13] = (Vertex *)0x0;
                      stack->m_size = uVar13 + 1;
                    }
                  }
                } while (((int)uVar19 < iVar10) || (iVar10 = stack->m_size, (int)uVar19 < iVar10));
              }
              if (iVar10 < 0) {
                if (stack->m_capacity < 0) {
                  if ((stack->m_data != (Vertex **)0x0) && (stack->m_ownsMemory == true)) {
                    btAlignedFreeInternal(stack->m_data);
                  }
                  stack->m_ownsMemory = true;
                  stack->m_data = (Vertex **)0x0;
                  stack->m_capacity = 0;
                }
                lVar45 = (long)iVar10;
                do {
                  stack->m_data[lVar45] = (Vertex *)0x0;
                  lVar45 = lVar45 + 1;
                } while (lVar45 != 0);
              }
              stack->m_size = 0;
              local_98 = local_98 | b & 0xffffffff;
              (face->origin).x = (int)local_98;
              (face->origin).y = (int)(local_98 >> 0x20);
              (face->origin).z = (undefined4)local_a0;
              (face->origin).index = local_a0._4_4_;
              return true;
            }
            pEVar28 = pEVar14->reverse;
            local_c0 = pEVar17;
            local_b8 = pEVar14;
            do {
              pEVar28 = pEVar28->reverse->prev;
              Vertex::dot(&local_110,pEVar28->target,&local_128);
              iVar12 = Rational128::compare(&local_110,lVar45);
            } while (iVar12 < 0);
            if (iVar12 != 0) {
              local_68 = pEVar28->reverse;
              local_60 = pEVar28->target;
              pEVar14 = local_68->prev;
              if (pEVar14 == local_68) {
                pEVar14 = (Edge *)0x0;
              }
              else {
                pEVar17 = local_68->next;
                pEVar14->next = pEVar17;
                pEVar17->prev = pEVar14;
                local_68->next = local_68;
                local_68->prev = local_68;
              }
              local_60->edges = pEVar14;
              pFVar5 = pEVar28->face;
              iVar11 = (pFVar5->dir0).x;
              iVar37 = (pFVar5->dir0).y;
              iVar44 = (pFVar5->dir1).z;
              iVar2 = (pFVar5->dir0).z;
              iVar3 = (pFVar5->dir1).y;
              lVar29 = (long)(iVar44 * iVar37 - iVar3 * iVar2);
              iVar4 = (pFVar5->dir1).x;
              lVar39 = (long)(iVar2 * iVar4 - iVar44 * iVar11);
              lVar24 = (long)(iVar11 * iVar3 - iVar4 * iVar37);
              pFVar6 = local_68->face;
              iVar11 = (pFVar6->dir0).x;
              iVar37 = (pFVar6->dir0).y;
              iVar44 = (pFVar6->dir1).z;
              iVar2 = (pFVar6->dir0).z;
              iVar3 = (pFVar6->dir1).y;
              iVar4 = (pFVar6->dir1).x;
              lVar46 = (long)(face->dir0).x;
              lVar41 = (long)(face->dir0).y;
              lVar34 = (long)(face->dir0).z;
              b_00 = lVar34 * lVar24 + lVar41 * lVar39 + lVar46 * lVar29;
              lVar40 = (long)(face->dir1).x;
              lVar45 = (long)(face->dir1).y;
              lVar30 = (long)(face->dir1).z;
              lVar31 = lVar30 * lVar24 + lVar45 * lVar39 + lVar40 * lVar29;
              lVar35 = (long)(iVar44 * iVar37 - iVar3 * iVar2);
              lVar33 = (long)(iVar2 * iVar4 - iVar44 * iVar11);
              lVar32 = (long)(iVar11 * iVar3 - iVar4 * iVar37);
              lVar34 = lVar34 * lVar32 + lVar41 * lVar33 + lVar46 * lVar35;
              lVar30 = lVar30 * lVar32 + lVar45 * lVar33 + lVar40 * lVar35;
              lVar24 = ((pFVar5->origin).z - local_90) * lVar24 +
                       ((pFVar5->origin).y - local_88) * lVar39 +
                       ((long)(pFVar5->origin).x - (long)local_130) * lVar29;
              lVar29 = ((pFVar6->origin).z - local_90) * lVar32 +
                       ((pFVar6->origin).y - local_88) * lVar33 +
                       ((long)(pFVar6->origin).x - (long)local_130) * lVar35;
              IVar55 = Int128::mul(b_00,lVar30);
              IVar56 = Int128::mul(lVar31,lVar34);
              local_b0.low = IVar55.low - IVar56.low;
              local_b0.high =
                   ~IVar56.high + IVar55.high + (ulong)(IVar56.low == 0) +
                   (ulong)(local_b0.low < IVar55.low);
              pVVar15 = Pool<btConvexHullInternal::Vertex>::newObject(local_80);
              *(undefined8 *)&(pVVar15->point).index = 0xffffffffffffffff;
              lVar45 = (long)(face->dir0).x;
              IVar55 = Int128::mul(lVar24 * lVar45,lVar30);
              IVar56 = Int128::mul(lVar45 * lVar29,lVar31);
              local_168 = IVar56.high;
              uVar19 = IVar55.low - IVar56.low;
              lVar45 = (long)(face->dir1).x;
              IVar57 = Int128::mul(lVar29 * lVar45,b_00);
              IVar58 = Int128::mul(lVar45 * lVar24,lVar34);
              IVar59 = Int128::operator*(&local_b0,b);
              uVar25 = IVar57.low + uVar19;
              uVar20 = uVar25 - IVar58.low;
              lVar45 = (long)(face->dir0).y;
              IVar60 = Int128::mul(lVar24 * lVar45,lVar30);
              IVar61 = Int128::mul(lVar45 * lVar29,lVar31);
              uVar21 = IVar60.low - IVar61.low;
              lVar45 = (long)(face->dir1).y;
              IVar62 = Int128::mul(lVar29 * lVar45,b_00);
              local_78 = IVar62.high;
              IVar63 = Int128::mul(lVar45 * lVar24,lVar34);
              local_70 = IVar63.low;
              bVar48 = local_70 == 0;
              IVar64 = Int128::operator*(&local_b0,local_c8);
              lVar45 = (IVar60.high - IVar61.high) + local_78;
              uVar26 = IVar62.low + uVar21;
              uVar22 = uVar26 - local_70;
              lVar32 = (long)(face->dir0).z;
              IVar65 = Int128::mul(lVar24 * lVar32,lVar30);
              IVar66 = Int128::mul(lVar32 * lVar29,lVar31);
              local_170 = IVar66.high;
              uVar47 = IVar65.low - IVar66.low;
              lVar31 = (long)(face->dir1).z;
              IVar67 = Int128::mul(lVar29 * lVar31,b_00);
              IVar68 = Int128::mul(lVar24 * lVar31,lVar34);
              IVar69 = Int128::operator*(&local_b0,local_d0);
              uVar36 = IVar67.low + uVar47;
              uVar23 = uVar36 - IVar68.low;
              (pVVar15->point128).x.low = uVar20 + IVar59.low;
              (pVVar15->point128).x.high =
                   (ulong)(uVar20 < uVar25) +
                   (ulong)(IVar58.low == 0) +
                   (((IVar55.high - local_168) + IVar57.high + (ulong)(IVar56.low == 0)) -
                   IVar58.high) + IVar59.high + (ulong)(uVar19 < IVar55.low) + -2 +
                   (ulong)CARRY8(IVar57.low,uVar19) + (ulong)CARRY8(uVar20,IVar59.low);
              (pVVar15->point128).y.low = uVar22 + IVar64.low;
              (pVVar15->point128).y.high =
                   (ulong)(uVar22 < uVar26) +
                   (ulong)bVar48 +
                   ((lVar45 + (ulong)(IVar61.low == 0)) - IVar63.high) + IVar64.high +
                   (ulong)(uVar21 < IVar60.low) + -2 + (ulong)CARRY8(IVar62.low,uVar21) +
                   (ulong)CARRY8(uVar22,IVar64.low);
              (pVVar15->point128).z.low = uVar23 + IVar69.low;
              (pVVar15->point128).z.high =
                   (ulong)(uVar23 < uVar36) +
                   (ulong)(IVar68.low == 0) +
                   (((IVar65.high - local_170) + IVar67.high + (ulong)(IVar66.low == 0)) -
                   IVar68.high) + IVar69.high + (ulong)(uVar47 < IVar65.low) + -2 +
                   (ulong)CARRY8(IVar67.low,uVar47) + (ulong)CARRY8(uVar23,IVar69.low);
              this_00 = &(pVVar15->point128).denominator;
              (pVVar15->point128).denominator.low = local_b0.low;
              (pVVar15->point128).denominator.high = local_b0.high;
              bVar49 = Int128::toScalar(&(pVVar15->point128).x);
              bVar50 = Int128::toScalar(this_00);
              (pVVar15->point).x = (int)(bVar49 / bVar50);
              bVar49 = Int128::toScalar(&(pVVar15->point128).y);
              bVar50 = Int128::toScalar(this_00);
              (pVVar15->point).y = (int)(bVar49 / bVar50);
              bVar49 = Int128::toScalar(&(pVVar15->point128).z);
              bVar50 = Int128::toScalar(this_00);
              (pVVar15->point).z = (int)(bVar49 / bVar50);
              pEVar28->target = pVVar15;
              pVVar15->edges = local_68;
              uVar13 = stack->m_size;
              uVar43 = stack->m_capacity;
              if (uVar13 == stack->m_capacity) {
                uVar42 = uVar13 * 2;
                if (uVar13 == 0) {
                  uVar42 = 1;
                }
                uVar43 = uVar13;
                if ((int)uVar13 < (int)uVar42) {
                  if (uVar42 == 0) {
                    ppVVar16 = (Vertex **)0x0;
                  }
                  else {
                    ppVVar16 = (Vertex **)btAlignedAllocInternal((long)(int)uVar42 << 3,0x10);
                    uVar13 = stack->m_size;
                  }
                  if (0 < (int)uVar13) {
                    uVar19 = 0;
                    do {
                      ppVVar16[uVar19] = stack->m_data[uVar19];
                      uVar19 = uVar19 + 1;
                    } while (uVar13 != uVar19);
                  }
                  if ((stack->m_data != (Vertex **)0x0) && (stack->m_ownsMemory == true)) {
                    btAlignedFreeInternal(stack->m_data);
                    uVar13 = stack->m_size;
                  }
                  stack->m_ownsMemory = true;
                  stack->m_data = ppVVar16;
                  stack->m_capacity = uVar42;
                  uVar43 = uVar42;
                }
              }
              stack->m_data[(int)uVar13] = pVVar15;
              uVar13 = uVar13 + 1;
              stack->m_size = uVar13;
              if (uVar13 == uVar43) {
                uVar19 = (ulong)(uVar43 * 2);
                if (uVar43 == 0) {
                  uVar19 = 1;
                }
                iVar11 = (int)uVar19;
                if ((int)uVar43 < iVar11) {
                  if (iVar11 == 0) {
                    ppVVar16 = (Vertex **)0x0;
                  }
                  else {
                    ppVVar16 = (Vertex **)btAlignedAllocInternal((long)iVar11 << 3,0x10);
                    uVar43 = stack->m_size;
                  }
                  if (0 < (int)uVar43) {
                    uVar20 = 0;
                    do {
                      ppVVar16[uVar20] = stack->m_data[uVar20];
                      uVar20 = uVar20 + 1;
                    } while (uVar43 != uVar20);
                  }
                  if ((stack->m_data != (Vertex **)0x0) && (stack->m_ownsMemory == true)) {
                    btAlignedFreeInternal(stack->m_data);
                    uVar43 = stack->m_size;
                  }
                  stack->m_ownsMemory = true;
                  stack->m_data = ppVVar16;
                  stack->m_capacity = iVar11;
                  uVar13 = uVar43;
                }
                else {
                  uVar19 = (ulong)uVar43;
                  uVar13 = uVar43;
                }
              }
              else {
                uVar19 = (ulong)uVar43;
              }
              stack->m_data[(int)uVar13] = local_60;
              iVar11 = uVar13 + 1;
              stack->m_size = iVar11;
              iVar37 = (int)uVar19;
              if (iVar11 == iVar37) {
                iVar44 = iVar37 * 2;
                if (iVar37 == 0) {
                  iVar44 = 1;
                }
                iVar11 = iVar37;
                if (iVar37 < iVar44) {
                  if (iVar44 == 0) {
                    ppVVar16 = (Vertex **)0x0;
                  }
                  else {
                    ppVVar16 = (Vertex **)btAlignedAllocInternal((long)iVar44 << 3,0x10);
                    uVar19 = (ulong)(uint)stack->m_size;
                  }
                  iVar11 = (int)uVar19;
                  if (0 < iVar11) {
                    uVar20 = 0;
                    do {
                      ppVVar16[uVar20] = stack->m_data[uVar20];
                      uVar20 = uVar20 + 1;
                    } while (uVar19 != uVar20);
                  }
                  if ((stack->m_data != (Vertex **)0x0) && (stack->m_ownsMemory == true)) {
                    btAlignedFreeInternal(stack->m_data);
                    iVar11 = stack->m_size;
                  }
                  stack->m_ownsMemory = true;
                  stack->m_data = ppVVar16;
                  stack->m_capacity = iVar44;
                }
              }
              stack->m_data[iVar11] = (Vertex *)0x0;
              stack->m_size = iVar11 + 1;
              lVar45 = local_d8;
            }
            pEVar14 = local_b8;
            if ((iVar12 != 0 || iVar10 != 0) ||
               (pEVar17 = local_b8->reverse->next, pEVar17->target != pEVar28->target)) {
              pEVar17 = newEdgePair(this,local_b8->target,pEVar28->target);
              if (iVar10 == 0) {
                pEVar14 = pEVar14->reverse;
                pEVar18 = pEVar14->next;
                pEVar17->next = pEVar18;
                pEVar18->prev = pEVar17;
LAB_0012c632:
                pEVar14->next = pEVar17;
                pEVar17->prev = pEVar14;
              }
              else if (pEVar38 != (Edge *)0x0) {
                pEVar14 = local_b8->reverse;
                goto LAB_0012c632;
              }
              if (iVar12 == 0) {
                pEVar18 = pEVar28->reverse;
                pEVar7 = pEVar18->prev;
                pEVar14 = pEVar17->reverse;
                pEVar7->next = pEVar14;
                pEVar14->prev = pEVar7;
              }
              else {
                pEVar14 = pEVar17->reverse;
                pEVar18 = pEVar28->reverse;
              }
              pEVar14->next = pEVar18;
              pEVar18->prev = pEVar14;
            }
            if (pEVar38 != (Edge *)0x0) {
              pEVar14 = pEVar38->reverse;
              if (iVar10 < 1) {
                if (pEVar17 != pEVar14) {
                  uVar13 = stack->m_size;
                  uVar43 = stack->m_capacity;
                  if (uVar13 == stack->m_capacity) {
                    uVar42 = uVar13 * 2;
                    if (uVar13 == 0) {
                      uVar42 = 1;
                    }
                    uVar43 = uVar13;
                    if ((int)uVar13 < (int)uVar42) {
                      if (uVar42 == 0) {
                        ppVVar16 = (Vertex **)0x0;
                      }
                      else {
                        ppVVar16 = (Vertex **)btAlignedAllocInternal((long)(int)uVar42 << 3,0x10);
                        uVar13 = stack->m_size;
                      }
                      if (0 < (int)uVar13) {
                        uVar19 = 0;
                        do {
                          ppVVar16[uVar19] = stack->m_data[uVar19];
                          uVar19 = uVar19 + 1;
                        } while (uVar13 != uVar19);
                      }
                      if ((stack->m_data != (Vertex **)0x0) && (stack->m_ownsMemory == true)) {
                        btAlignedFreeInternal(stack->m_data);
                        uVar13 = stack->m_size;
                      }
                      stack->m_ownsMemory = true;
                      stack->m_data = ppVVar16;
                      stack->m_capacity = uVar42;
                      uVar43 = uVar42;
                    }
                  }
                  stack->m_data[(int)uVar13] = pEVar38->target;
                  uVar13 = uVar13 + 1;
                  stack->m_size = uVar13;
                  pEVar14 = pEVar17->next;
                  if (pEVar14 != pEVar38->reverse) {
                    do {
                      pVVar15 = pEVar14->target;
                      removeEdgePair(this,pEVar14);
                      uVar13 = stack->m_size;
                      uVar43 = stack->m_capacity;
                      if (uVar13 == stack->m_capacity) {
                        uVar42 = uVar13 * 2;
                        if (uVar13 == 0) {
                          uVar42 = 1;
                        }
                        uVar43 = uVar13;
                        if ((int)uVar13 < (int)uVar42) {
                          if (uVar42 == 0) {
                            ppVVar16 = (Vertex **)0x0;
                          }
                          else {
                            ppVVar16 = (Vertex **)
                                       btAlignedAllocInternal((long)(int)uVar42 << 3,0x10);
                            uVar13 = stack->m_size;
                          }
                          if (0 < (int)uVar13) {
                            uVar19 = 0;
                            do {
                              ppVVar16[uVar19] = stack->m_data[uVar19];
                              uVar19 = uVar19 + 1;
                            } while (uVar13 != uVar19);
                          }
                          if ((stack->m_data != (Vertex **)0x0) && (stack->m_ownsMemory == true)) {
                            btAlignedFreeInternal(stack->m_data);
                            uVar13 = stack->m_size;
                          }
                          stack->m_ownsMemory = true;
                          stack->m_data = ppVVar16;
                          stack->m_capacity = uVar42;
                          uVar43 = uVar42;
                        }
                      }
                      stack->m_data[(int)uVar13] = pVVar15;
                      uVar13 = uVar13 + 1;
                      stack->m_size = uVar13;
                      pEVar14 = pEVar17->next;
                    } while (pEVar14 != pEVar38->reverse);
                  }
                  if (uVar13 == uVar43) {
                    iVar10 = uVar43 * 2;
                    if (uVar43 == 0) {
                      iVar10 = 1;
                    }
                    uVar13 = uVar43;
                    if ((int)uVar43 < iVar10) {
                      if (iVar10 == 0) {
                        ppVVar16 = (Vertex **)0x0;
                      }
                      else {
                        ppVVar16 = (Vertex **)btAlignedAllocInternal((long)iVar10 << 3,0x10);
                        uVar43 = stack->m_size;
                      }
                      if (0 < (int)uVar43) {
                        uVar19 = 0;
                        do {
                          ppVVar16[uVar19] = stack->m_data[uVar19];
                          uVar19 = uVar19 + 1;
                        } while (uVar43 != uVar19);
                      }
                      if ((stack->m_data != (Vertex **)0x0) && (stack->m_ownsMemory == true)) {
                        btAlignedFreeInternal(stack->m_data);
                        uVar43 = stack->m_size;
                      }
                      stack->m_ownsMemory = true;
                      stack->m_data = ppVVar16;
                      stack->m_capacity = iVar10;
                      uVar13 = uVar43;
                    }
                  }
                  stack->m_data[(int)uVar13] = (Vertex *)0x0;
                  stack->m_size = uVar13 + 1;
                  lVar45 = local_d8;
                }
              }
              else {
                pEVar17->next = pEVar14;
                pEVar14->prev = pEVar17;
              }
            }
            pEVar17->face = face;
            pEVar17->reverse->face = pEVar28->face;
            pEVar38 = pEVar17;
            iVar10 = iVar12;
            if (local_188 == (Edge *)0x0) {
              local_188 = pEVar17;
            }
          } while( true );
        }
      }
      pEVar28 = pEVar28->prev;
      iVar10 = iVar12;
    } while (pEVar28 != pEVar38);
  }
  return false;
}

Assistant:

bool btConvexHullInternal::shiftFace(Face* face, btScalar amount, btAlignedObjectArray<Vertex*> stack)
{
	btVector3 origShift = getBtNormal(face) * -amount;
	if (scaling[0] != 0)
	{
		origShift[0] /= scaling[0];
	}
	if (scaling[1] != 0)
	{
		origShift[1] /= scaling[1];
	}
	if (scaling[2] != 0)
	{
		origShift[2] /= scaling[2];
	}
	Point32 shift((int32_t) origShift[medAxis], (int32_t) origShift[maxAxis], (int32_t) origShift[minAxis]);
	if (shift.isZero())
	{
		return true;
	}
	Point64 normal = face->getNormal();
#ifdef DEBUG_CONVEX_HULL
	printf("\nShrinking face (%d %d %d) (%d %d %d) (%d %d %d) by (%d %d %d)\n",
				 face->origin.x, face->origin.y, face->origin.z, face->dir0.x, face->dir0.y, face->dir0.z, face->dir1.x, face->dir1.y, face->dir1.z, shift.x, shift.y, shift.z);
#endif
	int64_t origDot = face->origin.dot(normal);
	Point32 shiftedOrigin = face->origin + shift;
	int64_t shiftedDot = shiftedOrigin.dot(normal);
	btAssert(shiftedDot <= origDot);
	if (shiftedDot >= origDot)
	{
		return false;
	}

	Edge* intersection = NULL;

	Edge* startEdge = face->nearbyVertex->edges;
#ifdef DEBUG_CONVEX_HULL
	printf("Start edge is ");
	startEdge->print();
	printf(", normal is (%lld %lld %lld), shifted dot is %lld\n", normal.x, normal.y, normal.z, shiftedDot);
#endif
	Rational128 optDot = face->nearbyVertex->dot(normal);
	int cmp = optDot.compare(shiftedDot);
#ifdef SHOW_ITERATIONS
	int n = 0;
#endif
	if (cmp >= 0)
	{
		Edge* e = startEdge;
		do
		{
#ifdef SHOW_ITERATIONS
			n++;
#endif
			Rational128 dot = e->target->dot(normal);
			btAssert(dot.compare(origDot) <= 0);
#ifdef DEBUG_CONVEX_HULL
			printf("Moving downwards, edge is ");
			e->print();
			printf(", dot is %f (%f %lld)\n", (float) dot.toScalar(), (float) optDot.toScalar(), shiftedDot);
#endif
			if (dot.compare(optDot) < 0)
			{
				int c = dot.compare(shiftedDot);
				optDot = dot;
				e = e->reverse;
				startEdge = e;
				if (c < 0)
				{
					intersection = e;
					break;
				}
				cmp = c;
			}
			e = e->prev;
		} while (e != startEdge);

		if (!intersection)
		{
			return false;
		}
	}
	else
	{
		Edge* e = startEdge;
		do
		{
#ifdef SHOW_ITERATIONS
			n++;
#endif
			Rational128 dot = e->target->dot(normal);
			btAssert(dot.compare(origDot) <= 0);
#ifdef DEBUG_CONVEX_HULL
			printf("Moving upwards, edge is ");
			e->print();
			printf(", dot is %f (%f %lld)\n", (float) dot.toScalar(), (float) optDot.toScalar(), shiftedDot);
#endif
			if (dot.compare(optDot) > 0)
			{
				cmp = dot.compare(shiftedDot);
				if (cmp >= 0)
				{
					intersection = e;
					break;
				}
				optDot = dot;
				e = e->reverse;
				startEdge = e;
			}
			e = e->prev;
		} while (e != startEdge);
		
		if (!intersection)
		{
			return true;
		}
	}

#ifdef SHOW_ITERATIONS
	printf("Needed %d iterations to find initial intersection\n", n);
#endif

	if (cmp == 0)
	{
		Edge* e = intersection->reverse->next;
#ifdef SHOW_ITERATIONS
		n = 0;
#endif
		while (e->target->dot(normal).compare(shiftedDot) <= 0)
		{
#ifdef SHOW_ITERATIONS
			n++;
#endif
			e = e->next;
			if (e == intersection->reverse)
			{
				return true;
			}
#ifdef DEBUG_CONVEX_HULL
			printf("Checking for outwards edge, current edge is ");
			e->print();
			printf("\n");
#endif
		}
#ifdef SHOW_ITERATIONS
		printf("Needed %d iterations to check for complete containment\n", n);
#endif
	}
	
	Edge* firstIntersection = NULL;
	Edge* faceEdge = NULL;
	Edge* firstFaceEdge = NULL;

#ifdef SHOW_ITERATIONS
	int m = 0;
#endif
	while (true)
	{
#ifdef SHOW_ITERATIONS
		m++;
#endif
#ifdef DEBUG_CONVEX_HULL
		printf("Intersecting edge is ");
		intersection->print();
		printf("\n");
#endif
		if (cmp == 0)
		{
			Edge* e = intersection->reverse->next;
			startEdge = e;
#ifdef SHOW_ITERATIONS
			n = 0;
#endif
			while (true)
			{
#ifdef SHOW_ITERATIONS
				n++;
#endif
				if (e->target->dot(normal).compare(shiftedDot) >= 0)
				{
					break;
				}
				intersection = e->reverse;
				e = e->next;
				if (e == startEdge)
				{
					return true;
				}
			}
#ifdef SHOW_ITERATIONS
			printf("Needed %d iterations to advance intersection\n", n);
#endif
		}

#ifdef DEBUG_CONVEX_HULL
		printf("Advanced intersecting edge to ");
		intersection->print();
		printf(", cmp = %d\n", cmp);
#endif

		if (!firstIntersection)
		{
			firstIntersection = intersection;
		}
		else if (intersection == firstIntersection)
		{
			break;
		}

		int prevCmp = cmp;
		Edge* prevIntersection = intersection;
		Edge* prevFaceEdge = faceEdge;

		Edge* e = intersection->reverse;
#ifdef SHOW_ITERATIONS
		n = 0;
#endif
		while (true)
		{
#ifdef SHOW_ITERATIONS
			n++;
#endif
			e = e->reverse->prev;
			btAssert(e != intersection->reverse);
			cmp = e->target->dot(normal).compare(shiftedDot);
#ifdef DEBUG_CONVEX_HULL
			printf("Testing edge ");
			e->print();
			printf(" -> cmp = %d\n", cmp);
#endif
			if (cmp >= 0)
			{
				intersection = e;
				break;
			}
		}
#ifdef SHOW_ITERATIONS
		printf("Needed %d iterations to find other intersection of face\n", n);
#endif

		if (cmp > 0)
		{
			Vertex* removed = intersection->target;
			e = intersection->reverse;
			if (e->prev == e)
			{
				removed->edges = NULL;
			}
			else
			{
				removed->edges = e->prev;
				e->prev->link(e->next);
				e->link(e);
			}
#ifdef DEBUG_CONVEX_HULL
			printf("1: Removed part contains (%d %d %d)\n", removed->point.x, removed->point.y, removed->point.z);
#endif
			
			Point64 n0 = intersection->face->getNormal();
			Point64 n1 = intersection->reverse->face->getNormal();
			int64_t m00 = face->dir0.dot(n0);
			int64_t m01 = face->dir1.dot(n0);
			int64_t m10 = face->dir0.dot(n1);
			int64_t m11 = face->dir1.dot(n1);
			int64_t r0 = (intersection->face->origin - shiftedOrigin).dot(n0);
			int64_t r1 = (intersection->reverse->face->origin - shiftedOrigin).dot(n1);
			Int128 det = Int128::mul(m00, m11) - Int128::mul(m01, m10);
			btAssert(det.getSign() != 0);
			Vertex* v = vertexPool.newObject();
			v->point.index = -1;
			v->copy = -1;
			v->point128 = PointR128(Int128::mul(face->dir0.x * r0, m11) - Int128::mul(face->dir0.x * r1, m01)
															+ Int128::mul(face->dir1.x * r1, m00) - Int128::mul(face->dir1.x * r0, m10) + det * shiftedOrigin.x,
															Int128::mul(face->dir0.y * r0, m11) - Int128::mul(face->dir0.y * r1, m01)
															+ Int128::mul(face->dir1.y * r1, m00) - Int128::mul(face->dir1.y * r0, m10) + det * shiftedOrigin.y,
															Int128::mul(face->dir0.z * r0, m11) - Int128::mul(face->dir0.z * r1, m01)
															+ Int128::mul(face->dir1.z * r1, m00) - Int128::mul(face->dir1.z * r0, m10) + det * shiftedOrigin.z,
															det);
			v->point.x = (int32_t) v->point128.xvalue();
			v->point.y = (int32_t) v->point128.yvalue();
			v->point.z = (int32_t) v->point128.zvalue();
			intersection->target = v;
			v->edges = e;

			stack.push_back(v);
			stack.push_back(removed);
			stack.push_back(NULL);
		}

		if (cmp || prevCmp || (prevIntersection->reverse->next->target != intersection->target))
		{
			faceEdge = newEdgePair(prevIntersection->target, intersection->target);
			if (prevCmp == 0)
			{
				faceEdge->link(prevIntersection->reverse->next);
			}
			if ((prevCmp == 0) || prevFaceEdge)
			{
				prevIntersection->reverse->link(faceEdge);
			}
			if (cmp == 0)
			{
				intersection->reverse->prev->link(faceEdge->reverse);
			}
			faceEdge->reverse->link(intersection->reverse);
		}
		else
		{
			faceEdge = prevIntersection->reverse->next;
		}

		if (prevFaceEdge)
		{
			if (prevCmp > 0)
			{
				faceEdge->link(prevFaceEdge->reverse);
			}
			else if (faceEdge != prevFaceEdge->reverse)
			{
				stack.push_back(prevFaceEdge->target);
				while (faceEdge->next != prevFaceEdge->reverse)
				{
					Vertex* removed = faceEdge->next->target;
					removeEdgePair(faceEdge->next);
					stack.push_back(removed);
#ifdef DEBUG_CONVEX_HULL
					printf("2: Removed part contains (%d %d %d)\n", removed->point.x, removed->point.y, removed->point.z);
#endif
				}
				stack.push_back(NULL);
			}
		}
		faceEdge->face = face;
		faceEdge->reverse->face = intersection->face;

		if (!firstFaceEdge)
		{
			firstFaceEdge = faceEdge;
		}
	}
#ifdef SHOW_ITERATIONS
	printf("Needed %d iterations to process all intersections\n", m);
#endif

	if (cmp > 0)
	{
		firstFaceEdge->reverse->target = faceEdge->target;
		firstIntersection->reverse->link(firstFaceEdge);
		firstFaceEdge->link(faceEdge->reverse);
	}
	else if (firstFaceEdge != faceEdge->reverse)
	{
		stack.push_back(faceEdge->target);
		while (firstFaceEdge->next != faceEdge->reverse)
		{
			Vertex* removed = firstFaceEdge->next->target;
			removeEdgePair(firstFaceEdge->next);
			stack.push_back(removed);
#ifdef DEBUG_CONVEX_HULL
			printf("3: Removed part contains (%d %d %d)\n", removed->point.x, removed->point.y, removed->point.z);
#endif
		}
		stack.push_back(NULL);
	}

	btAssert(stack.size() > 0);
	vertexList = stack[0];

#ifdef DEBUG_CONVEX_HULL
	printf("Removing part\n");
#endif
#ifdef SHOW_ITERATIONS
	n = 0;
#endif
	int pos = 0;
	while (pos < stack.size())
	{
		int end = stack.size();
		while (pos < end)
		{
			Vertex* kept = stack[pos++];
#ifdef DEBUG_CONVEX_HULL
			kept->print();
#endif
			bool deeper = false;
			Vertex* removed;
			while ((removed = stack[pos++]) != NULL)
			{
#ifdef SHOW_ITERATIONS
				n++;
#endif
				kept->receiveNearbyFaces(removed);
				while (removed->edges)
				{
					if (!deeper)
					{
						deeper = true;
						stack.push_back(kept);
					}
					stack.push_back(removed->edges->target);
					removeEdgePair(removed->edges);
				}
			}
			if (deeper)
			{
				stack.push_back(NULL);
			}
		}
	}
#ifdef SHOW_ITERATIONS
	printf("Needed %d iterations to remove part\n", n);
#endif

	stack.resize(0);
	face->origin = shiftedOrigin;

	return true;
}